

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

string * __thiscall
libcellml::GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this,bool forDifferentialModel,
          bool withExternalVariables)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             ((long)&(this->mPimpl->mImplementationComputeVariablesMethodFamWoevString)._M_dataplus.
                     _M_p +
             (ulong)(uint)((int)CONCAT71(in_register_00000011,forDifferentialModel) << 7 |
                          (int)CONCAT71(in_register_00000009,withExternalVariables) << 6)));
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::implementationComputeVariablesMethodString(bool forDifferentialModel,
                                                                         bool withExternalVariables) const
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            return mPimpl->mImplementationComputeVariablesMethodFdmWevString;
        }

        return mPimpl->mImplementationComputeVariablesMethodFdmWoevString;
    }

    if (withExternalVariables) {
        return mPimpl->mImplementationComputeVariablesMethodFamWevString;
    }

    return mPimpl->mImplementationComputeVariablesMethodFamWoevString;
}